

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3MsrBufferData(Fts3MultiSegReader *pMsr,char *pList,int nList)

{
  char *pcVar1;
  char *pNew;
  int nList_local;
  char *pList_local;
  Fts3MultiSegReader *pMsr_local;
  
  if (pMsr->nBuffer < nList) {
    pMsr->nBuffer = nList << 1;
    pcVar1 = (char *)sqlite3_realloc(pMsr->aBuffer,pMsr->nBuffer);
    if (pcVar1 == (char *)0x0) {
      return 7;
    }
    pMsr->aBuffer = pcVar1;
  }
  memcpy(pMsr->aBuffer,pList,(long)nList);
  return 0;
}

Assistant:

static int fts3MsrBufferData(
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  char *pList,
  int nList
){
  if( nList>pMsr->nBuffer ){
    char *pNew;
    pMsr->nBuffer = nList*2;
    pNew = (char *)sqlite3_realloc(pMsr->aBuffer, pMsr->nBuffer);
    if( !pNew ) return SQLITE_NOMEM;
    pMsr->aBuffer = pNew;
  }

  memcpy(pMsr->aBuffer, pList, nList);
  return SQLITE_OK;
}